

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::ShaderSubroutine::FunctionalTest6::iterate(FunctionalTest6 *this)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  float *pfVar6;
  NotSupportedError *this_00;
  TestError *this_01;
  socklen_t __len;
  sockaddr *__addr;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  buffer transform_feedback_buffer;
  vertexArray vao;
  vec4<float> local_1d8;
  program program;
  MessageBuilder message;
  long lVar5;
  
  if (iterate()::input_data == '\0') {
    iVar3 = __cxa_guard_acquire(&iterate()::input_data);
    if (iVar3 != 0) {
      iterate::input_data = _DAT_016a9710;
      __cxa_guard_release(&iterate()::input_data);
    }
  }
  if (iterate()::expected_result == '\0') {
    iVar3 = __cxa_guard_acquire(&iterate()::expected_result);
    if (iVar3 != 0) {
      iterate::expected_result = _DAT_016a9750;
      __cxa_guard_release(&iterate()::expected_result);
    }
  }
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (bVar2) {
    transform_feedback_buffer.m_context = (this->super_TestCase).m_context;
    program.m_tesselation_control_shader_id = 0;
    program.m_tesselation_evaluation_shader_id = 0;
    program.m_vertex_shader_id = 0;
    program.m_compute_shader_id = 0;
    program.m_fragment_shader_id = 0;
    program.m_geometry_shader_id = 0;
    program.m_program_object_id = 0;
    transform_feedback_buffer.m_id = 0;
    vao.m_id = 0;
    iVar3 = 0;
    __len = 0;
    vao.m_context = transform_feedback_buffer.m_context;
    program.m_context = transform_feedback_buffer.m_context;
    Utils::program::build
              (&program,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
               "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\n// Subroutine type\nsubroutine vec4 routine_type(in vec4 iparam);\n\n// Subroutine definition\nsubroutine(routine_type) vec4 square(in vec4 iparam)\n{\n    return iparam * iparam;\n}\n\n// Sub routine uniform\nsubroutine uniform routine_type routine;\n\n// Input data\nuniform vec4 input_data;\n\n// Output\nout  vec4 out_result;\n\nvoid main()\n{\n    out_result  = square(input_data);\n}\n\n"
               ,&iterate::varying_name,1,false);
    Utils::program::use(&program);
    Utils::vertexArray::generate(&vao);
    Utils::vertexArray::bind(&vao,iVar3,__addr,__len);
    Utils::buffer::generate(&transform_feedback_buffer);
    Utils::buffer::update(&transform_feedback_buffer,0x8c8e,0x10,(GLvoid *)0x0,0x88ea);
    Utils::buffer::bindRange(&transform_feedback_buffer,0x8c8e,0,0,0x10);
    iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar5 = CONCAT44(extraout_var,iVar3);
    iVar3 = (**(code **)(lVar5 + 0xb48))(program.m_program_object_id,"input_data");
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"GetUniformLocation",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x10e3);
    if (iVar3 != -1) {
      (**(code **)(lVar5 + 0x15a0))
                (iterate::input_data.m_x,iterate::input_data.m_y,iterate::input_data.m_z,
                 iterate::input_data.m_w,iVar3);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"Uniform4f",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x10ec);
      (**(code **)(lVar5 + 0x30))(0);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"BeginTransformFeedback",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x10f0);
      (**(code **)(lVar5 + 0x538))(0,0,1);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"DrawArrays",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x10f3);
      (**(code **)(lVar5 + 0x638))();
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"EndTransformFeedback",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x10f6);
      pfVar6 = (float *)(**(code **)(lVar5 + 0xcf8))(0x8c8e,35000);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"MapBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x10fa);
      local_1d8.m_x = *pfVar6;
      local_1d8.m_y = pfVar6[1];
      local_1d8.m_z = pfVar6[2];
      local_1d8.m_w = pfVar6[3];
      (**(code **)(lVar5 + 0x1670))(0x8c8e);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"UnmapBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x10ff);
      bVar2 = Utils::vec4<float>::operator==(&iterate::expected_result,&local_1d8);
      if (bVar2) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        message.m_log = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = &message.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        "Error. Invalid result.");
        tcu::MessageBuilder::operator<<(&message,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
        message.m_log = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = &message.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        "Function: square( ");
        Utils::vec4<float>::log
                  (&iterate::input_data,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," ). Result: ");
        Utils::vec4<float>::log
                  (&local_1d8,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,". Expected: ");
        Utils::vec4<float>::log
                  (&iterate::expected_result,
                   (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
        tcu::MessageBuilder::operator<<(&message,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      }
      Utils::vertexArray::~vertexArray(&vao);
      Utils::buffer::~buffer(&transform_feedback_buffer);
      Utils::program::~program(&program);
      return STOP;
    }
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Uniform is not available",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x10e7);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&message,"GL_ARB_shader_subroutine is not supported.",
             (allocator<char> *)&program);
  tcu::NotSupportedError::NotSupportedError(this_00,(string *)&message);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest6::iterate()
{
	static const GLchar* vertex_shader_code = "#version 400 core\n"
											  "#extension GL_ARB_shader_subroutine : require\n"
											  "\n"
											  "precision highp float;\n"
											  "\n"
											  "// Subroutine type\n"
											  "subroutine vec4 routine_type(in vec4 iparam);\n"
											  "\n"
											  "// Subroutine definition\n"
											  "subroutine(routine_type) vec4 square(in vec4 iparam)\n"
											  "{\n"
											  "    return iparam * iparam;\n"
											  "}\n"
											  "\n"
											  "// Sub routine uniform\n"
											  "subroutine uniform routine_type routine;\n"
											  "\n"
											  "// Input data\n"
											  "uniform vec4 input_data;\n"
											  "\n"
											  "// Output\n"
											  "out  vec4 out_result;\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "    out_result  = square(input_data);\n"
											  "}\n"
											  "\n";

	static const GLchar* varying_name = "out_result";

	/* Test data */
	static const Utils::vec4<GLfloat> input_data(1.0f, 4.0f, 9.0f, 16.0f);

	static const Utils::vec4<GLfloat> expected_result(1.0f, 16.0f, 81.0f, 256.0f);

	static const GLuint transform_feedback_buffer_size = 4 * sizeof(GLfloat);

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* GL objects */
	Utils::program	 program(m_context);
	Utils::buffer	  transform_feedback_buffer(m_context);
	Utils::vertexArray vao(m_context);

	/* Init GL objects */
	program.build(0 /* cs */, 0 /* fs */, 0 /* gs */, 0 /* tcs */, 0 /* test */, vertex_shader_code, &varying_name,
				  1 /* n_varyings */);

	program.use();

	vao.generate();
	vao.bind();

	transform_feedback_buffer.generate();
	transform_feedback_buffer.update(GL_TRANSFORM_FEEDBACK_BUFFER, transform_feedback_buffer_size, 0 /* data */,
									 GL_DYNAMIC_COPY);
	transform_feedback_buffer.bindRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 0, transform_feedback_buffer_size);

	/* Test */
	{
		const glw::Functions& gl			   = m_context.getRenderContext().getFunctions();
		const GLint			  uniform_location = gl.getUniformLocation(program.m_program_object_id, "input_data");

		GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformLocation");

		if (-1 == uniform_location)
		{
			TCU_FAIL("Uniform is not available");
		}

		/* Set up input data uniforms */
		gl.uniform4f(uniform_location, input_data.m_x, input_data.m_y, input_data.m_z, input_data.m_w);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform4f");

		/* Execute draw call with transform feedback */
		gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BeginTransformFeedback");

		gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "EndTransformFeedback");

		/* Capture results */
		GLfloat* feedback_data = (GLfloat*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

		Utils::vec4<GLfloat> result(feedback_data[0], feedback_data[1], feedback_data[2], feedback_data[3]);

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

		/* Verify */
		if (expected_result == result)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
		else
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid result."
												<< tcu::TestLog::EndMessage;

			tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

			message << "Function: square( ";
			input_data.log(message);
			message << " ). Result: ";
			result.log(message);
			message << ". Expected: ";
			expected_result.log(message);

			message << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	/* Done */
	return tcu::TestNode::STOP;
}